

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

bool __thiscall argo::json::number_equal(json *this,json *other)

{
  long lVar1;
  json_exception *this_00;
  json *other_local;
  json *this_local;
  
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    lVar1 = std::__cxx11::string::size();
    if (lVar1 == 0) {
      if (this->m_type == number_int_e) {
        this_local._7_1_ = (this->m_value).u_number_int == (other->m_value).u_number_int;
      }
      else {
        this_local._7_1_ = (this->m_value).u_number_double == (other->m_value).u_number_double;
      }
      return this_local._7_1_;
    }
  }
  this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
  json_exception::json_exception(this_00,cant_compare_raw_e);
  __cxa_throw(this_00,&json_exception::typeinfo,json_exception::~json_exception);
}

Assistant:

bool json::number_equal(const json &other) const
{
    if (m_raw_value.size() == 0 && other.m_raw_value.size() == 0)
    {
        if (m_type == number_int_e)
        {
            return m_value.u_number_int == other.m_value.u_number_int;
        }
        else
        {
            // Will only work if they are exactly the same in all bits.
            return m_value.u_number_double == other.m_value.u_number_double;
        }
    }
    else
    {
        throw json_exception(json_exception::cant_compare_raw_e);
    }
}